

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  parasail_result_t *ppVar9;
  __m128i *ptr;
  __m128i *palVar10;
  __m128i *ptr_00;
  int64_t *ptr_01;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  ulong size;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  __m128i *ptr_02;
  int iVar31;
  long lVar32;
  bool bVar33;
  undefined1 auVar34 [12];
  __m128i alVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar40;
  long lVar43;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  __m128i_64_t B;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int64_t iVar47;
  long lVar48;
  undefined1 auVar49 [16];
  long lVar51;
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  __m128i_64_t e;
  __m128i_64_t h;
  longlong local_58 [5];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      parasail_nw_table_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar18 = profile->s1Len;
        if ((int)uVar18 < 1) {
          parasail_nw_table_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_striped_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_table_striped_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_nw_table_striped_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_table_striped_profile_sse41_128_64_cold_1();
        }
        else {
          iVar6 = uVar18 - 1;
          size = (ulong)uVar18 + 1 >> 1;
          iVar22 = (int)size;
          uVar13 = (ulong)(uint)open;
          iVar31 = -open;
          iVar8 = ppVar3->min;
          uVar30 = 0x8000000000000000 - (long)iVar8;
          if (iVar8 != iVar31 && SBORROW4(iVar8,iVar31) == iVar8 + open < 0) {
            uVar30 = uVar13 | 0x8000000000000000;
          }
          iVar8 = ppVar3->max;
          ppVar9 = parasail_result_new_table1((uint)((ulong)uVar18 + 1) & 0x7ffffffe,s2Len);
          if (ppVar9 != (parasail_result_t *)0x0) {
            ppVar9->flag = ppVar9->flag | 0x2820801;
            ptr = parasail_memalign___m128i(0x10,size);
            palVar10 = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (palVar10 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
              iVar7 = s2Len + -1;
              uVar36 = (ulong)(uint)gap;
              lVar11 = uVar30 + 1;
              lVar14 = 0x7ffffffffffffffe - (long)iVar8;
              auVar38._8_4_ = (int)lVar11;
              auVar38._0_8_ = lVar11;
              auVar38._12_4_ = (int)((ulong)lVar11 >> 0x20);
              auVar41._8_4_ = (int)lVar14;
              auVar41._0_8_ = lVar14;
              auVar41._12_4_ = (int)((ulong)lVar14 >> 0x20);
              uVar15 = (ulong)(uint)gap;
              lVar11 = (long)iVar31;
              uVar25 = 0;
              do {
                lVar26 = 0;
                lVar19 = lVar11;
                do {
                  local_58[lVar26 + 2] = lVar19;
                  local_58[lVar26] = lVar19 - uVar13;
                  lVar26 = lVar26 + 1;
                  lVar19 = lVar19 - size * uVar15;
                } while (lVar26 == 1);
                ptr[uVar25][0] = local_58[2];
                ptr[uVar25][1] = local_58[3];
                ptr_00[uVar25][0] = local_58[0];
                ptr_00[uVar25][1] = local_58[1];
                uVar25 = uVar25 + 1;
                lVar11 = lVar11 - uVar15;
              } while (uVar25 != size);
              *ptr_01 = 0;
              lVar11 = (long)iVar31;
              uVar25 = 1;
              do {
                ptr_01[uVar25] = lVar11;
                uVar25 = uVar25 + 1;
                lVar11 = lVar11 - uVar15;
              } while (s2Len + 1 != uVar25);
              uVar15 = 1;
              if (1 < s2Len) {
                uVar15 = (ulong)(uint)s2Len;
              }
              lVar19 = size * (uint)s2Len * 4;
              lVar11 = (ulong)(uint)s2Len * 4;
              lVar23 = (ulong)(iVar22 + (uint)(iVar22 == 0)) << 4;
              lVar26 = 0;
              uVar25 = 0;
              auVar44 = auVar38;
              do {
                ptr_02 = ptr;
                ptr = palVar10;
                palVar10 = ptr_02 + (iVar22 - 1);
                auVar49._8_4_ = (int)(*palVar10)[0];
                auVar49._0_8_ = (*palVar10)[0];
                auVar49._12_4_ = *(undefined4 *)((long)*palVar10 + 4);
                iVar8 = ppVar3->mapper[(byte)s2[uVar25]];
                iVar47 = ptr_01[uVar25];
                lVar51 = auVar49._8_8_;
                lVar27 = 0;
                lVar16 = lVar26;
                auVar45 = auVar38;
                do {
                  plVar1 = (long *)((long)pvVar2 + lVar27 + (long)iVar8 * (long)iVar22 * 0x10);
                  lVar48 = iVar47 + *plVar1;
                  lVar51 = lVar51 + plVar1[1];
                  lVar40 = *(long *)((long)*ptr_00 + lVar27);
                  if (lVar48 <= lVar40) {
                    lVar48 = lVar40;
                  }
                  lVar43 = *(long *)((long)*ptr_00 + lVar27 + 8);
                  if (lVar51 <= lVar43) {
                    lVar51 = lVar43;
                  }
                  lVar29 = auVar45._0_8_;
                  if (lVar48 <= lVar29) {
                    lVar48 = lVar29;
                  }
                  lVar32 = auVar45._8_8_;
                  if (lVar51 <= lVar32) {
                    lVar51 = lVar32;
                  }
                  lVar20 = auVar44._0_8_;
                  if (auVar44._0_8_ <= lVar48) {
                    lVar20 = lVar48;
                  }
                  lVar17 = auVar44._8_8_;
                  if (auVar44._8_8_ <= lVar51) {
                    lVar17 = lVar51;
                  }
                  lVar21 = auVar41._0_8_;
                  if (lVar48 <= auVar41._0_8_) {
                    lVar21 = lVar48;
                  }
                  lVar28 = auVar41._8_8_;
                  if (lVar51 <= auVar41._8_8_) {
                    lVar28 = lVar51;
                  }
                  if (lVar40 <= lVar21) {
                    lVar21 = lVar40;
                  }
                  if (lVar43 <= lVar28) {
                    lVar28 = lVar43;
                  }
                  if (lVar29 <= lVar21) {
                    lVar21 = lVar29;
                  }
                  plVar1 = (long *)((long)*ptr_00 + lVar27);
                  lVar40 = *plVar1;
                  lVar43 = plVar1[1];
                  plVar1 = (long *)((long)*ptr + lVar27);
                  *plVar1 = lVar48;
                  plVar1[1] = lVar51;
                  if (lVar32 <= lVar28) {
                    lVar28 = lVar32;
                  }
                  piVar4 = ((ppVar9->field_4).rowcols)->score_row;
                  *(int *)((long)piVar4 + lVar16) = (int)lVar48;
                  *(int *)((long)piVar4 + lVar19 + lVar16) = (int)lVar51;
                  lVar48 = lVar48 - uVar13;
                  lVar51 = lVar51 - (ulong)(uint)open;
                  lVar40 = lVar40 - uVar36;
                  uVar37 = (ulong)(uint)gap;
                  lVar43 = lVar43 - uVar37;
                  if (lVar40 <= lVar48) {
                    lVar40 = lVar48;
                  }
                  if (lVar43 <= lVar51) {
                    lVar43 = lVar51;
                  }
                  if (lVar48 < (long)(lVar29 - uVar36)) {
                    lVar48 = lVar29 - uVar36;
                  }
                  if (lVar51 < (long)(lVar32 - uVar37)) {
                    lVar51 = lVar32 - uVar37;
                  }
                  auVar44._8_8_ = lVar17;
                  auVar44._0_8_ = lVar20;
                  auVar41._8_8_ = lVar28;
                  auVar41._0_8_ = lVar21;
                  plVar1 = (long *)((long)*ptr_00 + lVar27);
                  *plVar1 = lVar40;
                  plVar1[1] = lVar43;
                  auVar45._8_8_ = lVar51;
                  auVar45._0_8_ = lVar48;
                  plVar1 = (long *)((long)*ptr_02 + lVar27);
                  iVar47 = *plVar1;
                  lVar51 = plVar1[1];
                  lVar27 = lVar27 + 0x10;
                  lVar16 = lVar16 + lVar11;
                } while (lVar23 != lVar27);
                iVar8 = 0;
                do {
                  auVar46._0_8_ = auVar45._0_8_;
                  auVar46._8_4_ = auVar45._0_4_;
                  auVar46._12_4_ = auVar45._4_4_;
                  auVar45._8_8_ = auVar46._8_8_;
                  auVar45._0_8_ = ptr_01[uVar25 + 1] - uVar13;
                  bVar33 = true;
                  uVar12 = 1;
                  lVar16 = 0;
                  lVar51 = lVar26;
                  do {
                    lVar43 = auVar45._0_8_;
                    lVar27 = *(long *)((long)*ptr + lVar16);
                    lVar40 = *(long *)((long)*ptr + lVar16 + 8);
                    lVar48 = lVar43;
                    if (lVar43 < lVar27) {
                      lVar48 = lVar27;
                    }
                    lVar29 = auVar45._8_8_;
                    lVar27 = lVar29;
                    if (lVar29 < lVar40) {
                      lVar27 = lVar40;
                    }
                    lVar40 = auVar41._0_8_;
                    if (lVar48 <= auVar41._0_8_) {
                      lVar40 = lVar48;
                    }
                    plVar1 = (long *)((long)*ptr + lVar16);
                    *plVar1 = lVar48;
                    plVar1[1] = lVar27;
                    lVar32 = auVar41._8_8_;
                    if (lVar27 <= auVar41._8_8_) {
                      lVar32 = lVar27;
                    }
                    lVar20 = auVar44._0_8_;
                    if (auVar44._0_8_ <= lVar48) {
                      lVar20 = lVar48;
                    }
                    auVar41._8_8_ = lVar32;
                    auVar41._0_8_ = lVar40;
                    lVar17 = auVar44._8_8_;
                    if (auVar44._8_8_ <= lVar27) {
                      lVar17 = lVar27;
                    }
                    auVar44._8_8_ = lVar17;
                    auVar44._0_8_ = lVar20;
                    piVar4 = ((ppVar9->field_4).rowcols)->score_row;
                    *(int *)((long)piVar4 + lVar51) = (int)lVar48;
                    lVar21 = (long)piVar4 + lVar51;
                    *(int *)(lVar19 + lVar21) = (int)lVar27;
                    auVar45._0_8_ = lVar43 - uVar36;
                    auVar45._8_8_ = lVar29 - uVar37;
                    auVar52._0_8_ = -(ulong)((long)(lVar48 - uVar13) < auVar45._0_8_);
                    auVar52._8_8_ = -(ulong)((long)(lVar27 - (ulong)(uint)open) < auVar45._8_8_);
                    uVar18 = movmskpd((int)lVar21,auVar52);
                    uVar24 = -(ulong)(byte)((byte)uVar18 >> 1);
                    auVar50._8_8_ = uVar24;
                    auVar50._0_8_ = -(ulong)(uVar18 & 1);
                    if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar50 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar50 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar50 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar50 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar50 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar50 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (uVar24 >> 7 & 1) == 0) && (uVar24 >> 0xf & 1) == 0) &&
                            (uVar24 >> 0x17 & 1) == 0) && (uVar24 >> 0x1f & 1) == 0) &&
                          (uVar24 >> 0x27 & 1) == 0) && (uVar24 >> 0x2f & 1) == 0) &&
                        (uVar24 >> 0x37 & 1) == 0) && -1 < (long)uVar24) break;
                    bVar33 = uVar12 < size;
                    lVar16 = lVar16 + 0x10;
                    lVar51 = lVar51 + lVar11;
                    uVar12 = uVar12 + 1;
                  } while (lVar23 != lVar16);
                } while ((!bVar33) && (bVar33 = iVar8 == 0, iVar8 = iVar8 + 1, bVar33));
                uVar25 = uVar25 + 1;
                lVar26 = lVar26 + 4;
                palVar10 = ptr_02;
                if (uVar25 == uVar15) {
                  alVar35 = ptr[(uint)(iVar6 % iVar22)];
                  auVar34 = alVar35._0_12_;
                  if (iVar6 / iVar22 < 1) {
                    do {
                      auVar5._8_8_ = 0;
                      auVar5._0_8_ = alVar35[0];
                      alVar35 = (__m128i)(auVar5 << 0x40);
                      auVar34 = alVar35._0_12_;
                    } while (iVar6 / iVar22 < 0);
                  }
                  auVar39._8_8_ = -(ulong)(lVar32 <= (long)uVar30);
                  auVar39._0_8_ = -(ulong)(lVar40 <= (long)uVar30);
                  auVar42._8_8_ = -(ulong)(lVar14 < lVar17);
                  auVar42._0_8_ = -(ulong)(lVar14 < lVar20);
                  auVar42 = auVar42 | auVar39;
                  if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar42 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar42 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar42 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar42 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar42 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar42 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar42 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar42 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar42 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar42 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar42 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar42 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar42[0xf]) {
                    iVar8 = auVar34._8_4_;
                  }
                  else {
                    *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
                    iVar8 = 0;
                    iVar7 = 0;
                    iVar6 = 0;
                  }
                  ppVar9->score = iVar8;
                  ppVar9->end_query = iVar6;
                  ppVar9->end_ref = iVar7;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr_02);
                  parasail_free(ptr);
                  return ppVar9;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}